

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
stringToUnits_modifiedStrings_Test::TestBody(stringToUnits_modifiedStrings_Test *this)

{
  uint64_t uVar1;
  pointer *__ptr;
  char *pcVar2;
  precise_unit u8;
  AssertionResult gtest_ar_7;
  precise_unit u7;
  precise_unit u4;
  precise_unit u6;
  precise_unit u5;
  AssertHelper local_178;
  precise_unit u3;
  precise_unit local_160;
  precise_unit u2;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  precise_unit u1;
  
  std::__cxx11::string::string((string *)&local_40,"linear yard",(allocator *)&u2);
  uVar1 = units::getDefaultFlags();
  u1 = units::unit_from_string(&local_40,uVar1);
  std::__cxx11::string::~string((string *)&local_40);
  u1.commodity_ = 0;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&u2,"u1","precise::yd",&u1,(precise_unit *)units::precise::yd);
  if (u2.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u3);
    if (u2._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)u2._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4e6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u4,(Message *)&u3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u4);
    if (u3.multiplier_ != 0.0) {
      (**(code **)(*(long *)u3.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u2.base_units_);
  std::__cxx11::string::string((string *)&local_60,"kilogram per millimetre",(allocator *)&u3);
  uVar1 = units::getDefaultFlags();
  u2 = units::unit_from_string(&local_60,uVar1);
  std::__cxx11::string::~string((string *)&local_60);
  u4 = units::precise_unit::operator/
                 ((precise_unit *)units::precise::kg,(precise_unit *)units::precise::mm);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&u3,"u2","precise::kg / precise::mm",&u2,&u4);
  if (u3.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u4);
    if (u3._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)u3._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4e9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u5,(Message *)&u4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u5);
    if (u4.multiplier_ != 0.0) {
      (**(code **)(*(long *)u4.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u3.base_units_);
  std::__cxx11::string::string
            ((string *)&local_80,"British thermal unit (59 degF)",(allocator *)&u4);
  uVar1 = units::getDefaultFlags();
  u3 = units::unit_from_string(&local_80,uVar1);
  std::__cxx11::string::~string((string *)&local_80);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&u4,"u3","precise::energy::btu_59",&u3,
             (precise_unit *)units::precise::energy::btu_59);
  if (u4.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u5);
    if (u4._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)u4._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4ec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u6,(Message *)&u5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u6);
    if (u5.multiplier_ != 0.0) {
      (**(code **)(*(long *)u5.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u4.base_units_);
  std::__cxx11::string::string((string *)&local_a0,"calorie (20 degC)",(allocator *)&u5);
  uVar1 = units::getDefaultFlags();
  u4 = units::unit_from_string(&local_a0,uVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&u5,"u4","precise::energy::cal_20",&u4,
             (precise_unit *)units::precise::energy::cal_20);
  if (u5.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u6);
    if (u5._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)u5._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u7,(Message *)&u6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u7);
    if (u6.multiplier_ != 0.0) {
      (**(code **)(*(long *)u6.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u5.base_units_);
  std::__cxx11::string::string((string *)&local_c0,"nanometre",(allocator *)&u6);
  uVar1 = units::getDefaultFlags();
  u5 = units::unit_from_string(&local_c0,uVar1);
  std::__cxx11::string::~string((string *)&local_c0);
  u7 = units::precise_unit::operator*
                 ((precise_unit *)units::precise::nano,(precise_unit *)units::precise::m);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&u6,"u5","precise::nano * precise::m",&u5,&u7);
  if (u6.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u7);
    if (u6._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)u6._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4f2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u8,(Message *)&u7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u8);
    if (u7.multiplier_ != 0.0) {
      (**(code **)(*(long *)u7.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u6.base_units_);
  std::__cxx11::string::string((string *)&local_e0,"ton (US) per hour",(allocator *)&u7);
  uVar1 = units::getDefaultFlags();
  u6 = units::unit_from_string(&local_e0,uVar1);
  std::__cxx11::string::~string((string *)&local_e0);
  u8 = units::precise_unit::operator/
                 ((precise_unit *)units::precise::ton,(precise_unit *)units::precise::hr);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&u7,"u6","precise::ton / precise::hr",&u6,&u8);
  if (u7.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u8);
    if (u7._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)u7._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4f5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&u8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if (u8.multiplier_ != 0.0) {
      (**(code **)(*(long *)u8.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u7.base_units_);
  std::__cxx11::string::string((string *)&local_100,"foot of water(39.2 degF)",(allocator *)&u8);
  uVar1 = units::getDefaultFlags();
  u7 = units::unit_from_string(&local_100,uVar1);
  std::__cxx11::string::~string((string *)&local_100);
  gtest_ar_7._0_8_ = &DAT_40a759f7ced91687;
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x1ef;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&u8,"u7","precise_unit(2988.98400, Pa)",&u7,(precise_unit *)&gtest_ar_7);
  if (u8.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (u8._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)u8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4f8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if (gtest_ar_7._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&u8.base_units_);
  std::__cxx11::string::string((string *)&local_120,"[qt_us]",(allocator *)&gtest_ar_7);
  uVar1 = units::getDefaultFlags();
  u8 = units::unit_from_string(&local_120,uVar1);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_140,"[QT_US]",(allocator *)&local_178);
  uVar1 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_140,uVar1);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar_7,"u8","unit_from_string(\"[QT_US]\")",&u8,&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&local_160);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4fb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((long *)local_160.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_160.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  return;
}

Assistant:

TEST(stringToUnits, modifiedStrings)
{
    auto u1 = unit_from_string("linear yard");
    u1.commodity(0);
    EXPECT_EQ(u1, precise::yd);

    auto u2 = unit_from_string("kilogram per millimetre");
    EXPECT_EQ(u2, precise::kg / precise::mm);

    auto u3 = unit_from_string("British thermal unit (59 degF)");
    EXPECT_EQ(u3, precise::energy::btu_59);

    auto u4 = unit_from_string("calorie (20 degC)");
    EXPECT_EQ(u4, precise::energy::cal_20);

    auto u5 = unit_from_string("nanometre");
    EXPECT_EQ(u5, precise::nano * precise::m);

    auto u6 = unit_from_string("ton (US) per hour");
    EXPECT_EQ(u6, precise::ton / precise::hr);

    auto u7 = unit_from_string("foot of water(39.2 degF)");
    EXPECT_EQ(u7, precise_unit(2988.98400, Pa));

    auto u8 = unit_from_string("[qt_us]");
    EXPECT_EQ(u8, unit_from_string("[QT_US]"));
}